

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O0

void __thiscall
t_javame_generator::generate_deep_copy_non_container
          (t_javame_generator *this,ostream *out,string *source_name,string *dest_name,t_type *type)

{
  uint uVar1;
  ostream *poVar2;
  string local_50;
  t_type *local_30;
  t_type *type_local;
  string *dest_name_local;
  string *source_name_local;
  ostream *out_local;
  t_javame_generator *this_local;
  
  local_30 = type;
  type_local = (t_type *)dest_name;
  dest_name_local = source_name;
  source_name_local = (string *)out;
  out_local = (ostream *)this;
  uVar1 = (*(type->super_t_doc)._vptr_t_doc[5])();
  if ((((uVar1 & 1) == 0) &&
      (uVar1 = (*(local_30->super_t_doc)._vptr_t_doc[10])(), (uVar1 & 1) == 0)) &&
     (uVar1 = (*(local_30->super_t_doc)._vptr_t_doc[9])(), (uVar1 & 1) == 0)) {
    poVar2 = std::operator<<((ostream *)source_name_local,"new ");
    type_name_abi_cxx11_(&local_50,this,local_30,true,true,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = std::operator<<(poVar2,(string *)source_name);
    std::operator<<(poVar2,")");
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    uVar1 = (*(local_30->super_t_doc)._vptr_t_doc[7])();
    if ((uVar1 & 1) == 0) {
      std::operator<<((ostream *)source_name_local,(string *)source_name);
    }
    else {
      poVar2 = std::operator<<((ostream *)source_name_local,"new byte[");
      poVar2 = std::operator<<(poVar2,(string *)source_name);
      poVar2 = std::operator<<(poVar2,".length];");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
      poVar2 = t_generator::indent((t_generator *)this,(ostream *)source_name_local);
      poVar2 = std::operator<<(poVar2,"System.arraycopy(");
      poVar2 = std::operator<<(poVar2,(string *)source_name);
      poVar2 = std::operator<<(poVar2,", 0, ");
      poVar2 = std::operator<<(poVar2,(string *)dest_name);
      poVar2 = std::operator<<(poVar2,", 0, ");
      poVar2 = std::operator<<(poVar2,(string *)source_name);
      std::operator<<(poVar2,".length)");
    }
  }
  return;
}

Assistant:

void t_javame_generator::generate_deep_copy_non_container(ostream& out,
                                                          std::string source_name,
                                                          std::string dest_name,
                                                          t_type* type) {
  if (type->is_base_type() || type->is_enum() || type->is_typedef()) {
    // binary fields need to be copied with System.arraycopy
    if (type->is_binary()) {
      out << "new byte[" << source_name << ".length];" << endl;
      indent(out) << "System.arraycopy(" << source_name << ", 0, " << dest_name << ", 0, "
                  << source_name << ".length)";
    }
    // everything else can be copied directly
    else
      out << source_name;
  } else {
    out << "new " << type_name(type, true, true) << "(" << source_name << ")";
  }
}